

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O3

bool __thiscall CStorage::FindFileImpl(CStorage *this,int Type,CFindCBData *pCBData)

{
  char *pcVar1;
  long lVar2;
  char (*pacVar3) [512];
  long in_FS_OFFSET;
  bool bVar4;
  char aBuf [512];
  char acStack_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pCBData->m_BufferSize < 1) {
    bVar4 = false;
  }
  else {
    *pCBData->m_pBuffer = '\0';
    if (Type == -1) {
      if (0 < this->m_NumPaths) {
        pacVar3 = this->m_aaStoragePaths;
        lVar2 = 0;
        do {
          pcVar1 = "";
          if ((*pacVar3)[0] != '\0') {
            pcVar1 = "/";
          }
          str_format(acStack_238,0x200,"%s%s%s",pacVar3,pcVar1,pCBData->m_pPath);
          fs_listdir(acStack_238,FindFileCallback,(int)lVar2,pCBData);
          if (*pCBData->m_pBuffer != '\0') {
            bVar4 = true;
            goto LAB_0013ea07;
          }
          lVar2 = lVar2 + 1;
          pacVar3 = pacVar3 + 1;
        } while (lVar2 < this->m_NumPaths);
      }
    }
    else if ((-1 < Type) && (Type < this->m_NumPaths)) {
      pcVar1 = "/";
      if (this->m_aaStoragePaths[(uint)Type][0] == '\0') {
        pcVar1 = "";
      }
      str_format(acStack_238,0x200,"%s%s%s",this->m_aaStoragePaths + (uint)Type,pcVar1,
                 pCBData->m_pPath);
      fs_listdir(acStack_238,FindFileCallback,Type,pCBData);
    }
    bVar4 = *pCBData->m_pBuffer != '\0';
  }
LAB_0013ea07:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool FindFileImpl(int Type, CFindCBData *pCBData)
	{
		if(pCBData->m_BufferSize < 1)
			return false;

		pCBData->m_pBuffer[0] = 0;

		char aBuf[IO_MAX_PATH_LENGTH];

		if(Type == TYPE_ALL)
		{
			// search within all available directories
			for(int i = 0; i < m_NumPaths; ++i)
			{
				fs_listdir(GetPath(i, pCBData->m_pPath, aBuf, sizeof(aBuf)), FindFileCallback, i, pCBData);
				if(pCBData->m_pBuffer[0])
					return true;
			}
		}
		else if(Type >= 0 && Type < m_NumPaths)
		{
			// search within wanted directory
			fs_listdir(GetPath(Type, pCBData->m_pPath, aBuf, sizeof(aBuf)), FindFileCallback, Type, pCBData);
		}

		return pCBData->m_pBuffer[0] != 0;
	}